

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryBooleanOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  IRContext *this_00;
  ConstantManager *pCVar1;
  uint **ppuVar2;
  bool bVar3;
  Operand *pOVar4;
  uint **ppuVar5;
  const_iterator cVar6;
  long lVar7;
  bool bVar8;
  long *plVar9;
  uint32_t uVar10;
  uint local_50;
  Op local_4c;
  long local_48;
  long local_40;
  uint32_t *local_38;
  
  local_4c = inst->opcode_;
  this_00 = this->context_;
  local_38 = result;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  pCVar1 = (this_00->constant_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  uVar10 = 0;
  plVar9 = &local_48;
  bVar3 = true;
  do {
    bVar8 = bVar3;
    pOVar4 = Instruction::GetInOperand(inst,uVar10);
    if (pOVar4->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ppuVar2 = (uint **)(pOVar4->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar5 = &(pOVar4->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar5 = ppuVar2;
    }
    local_50 = **ppuVar5;
    if ((id_map->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_50 = (*id_map->_M_invoker)((_Any_data *)id_map,&local_50);
    cVar6 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(pCVar1->id_to_const_val_)._M_h,&local_50);
    if ((cVar6.
         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (*(long **)((long)cVar6.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                         ._M_cur + 0x10) == (long *)0x0)) {
      lVar7 = 0;
    }
    else {
      lVar7 = (**(code **)(**(long **)((long)cVar6.
                                             super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false>
                                             ._M_cur + 0x10) + 0x80))();
    }
    *plVar9 = lVar7;
    uVar10 = 1;
    plVar9 = &local_40;
    bVar3 = false;
  } while (bVar8);
  if (local_4c == OpLogicalOr) {
    plVar9 = &local_48;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      if ((*plVar9 != 0) && (*(char *)(*plVar9 + 0x28) != '\0')) {
        uVar10 = 1;
        goto LAB_0020729a;
      }
      plVar9 = &local_40;
      bVar3 = false;
    } while (bVar8);
  }
  else if (local_4c == OpLogicalAnd) {
    plVar9 = &local_48;
    bVar3 = true;
    do {
      bVar8 = bVar3;
      if ((*plVar9 != 0) && (*(char *)(*plVar9 + 0x28) != '\x01')) {
        uVar10 = 0;
LAB_0020729a:
        *local_38 = uVar10;
        return true;
      }
      plVar9 = &local_40;
      bVar3 = false;
    } while (bVar8);
  }
  return false;
}

Assistant:

bool InstructionFolder::FoldBinaryBooleanOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::BoolConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsBoolConstant() : nullptr);
  }

  switch (opcode) {
    // Logical
    case spv::Op::OpLogicalOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->value()) {
            *result = true;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpLogicalAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (!constants[i]->value()) {
            *result = false;
            return true;
          }
        }
      }
      break;

    default:
      break;
  }
  return false;
}